

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteElemInitializers(CWriter *this)

{
  Module *pMVar1;
  bool bVar2;
  ExprType EVar3;
  vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_> *pvVar4;
  ExprListVector *this_00;
  VarExpr<(wabt::ExprType)36> *pVVar5;
  mapped_type *name;
  VarExpr<(wabt::ExprType)20> *pVVar6;
  size_type sVar7;
  const_reference ppTVar8;
  reference ppEVar9;
  ulong uVar10;
  uint local_298;
  Newline local_263;
  CloseBrace local_262;
  Newline local_261;
  GlobalName local_260;
  ElemSegment *local_250;
  ElemSegment *elem_segment_2;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_> *__range3_1;
  string local_228;
  Newline local_203;
  Newline local_202;
  CloseBrace local_201;
  Table *local_200;
  Table *table_1;
  ElemSegment *elem_segment_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_> *__range2_1;
  ExternalInstancePtr local_1d0;
  char *local_1c0;
  uint local_1b4;
  value_type pTStack_1b0;
  uint32_t max;
  Table *table;
  Index local_1a0;
  Index i;
  Index table_idx;
  Newline local_174;
  Newline local_173;
  CloseBrace local_172;
  Newline local_171;
  GlobalName local_170;
  string local_160;
  Global *local_140;
  Global *global;
  string_view local_130;
  GlobalName local_120;
  string local_110;
  string_view local_f0;
  string_view local_e0;
  TailCallRef local_d0;
  WrapperRef local_c0;
  FuncTypeExpr local_b0;
  FuncType *local_a8;
  FuncType *func_type;
  Func *func;
  Expr *expr;
  ExprList *elem_expr;
  const_iterator __end3;
  const_iterator __begin3;
  ExprListVector *__range3;
  GlobalName local_68;
  char *local_58;
  Newline local_49;
  Type local_48;
  ElemSegment *local_40;
  ElemSegment *elem_segment;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_> *__range2;
  CWriter *this_local;
  
  bVar2 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::empty(&this->module_->tables);
  if (!bVar2) {
    pvVar4 = &this->module_->elem_segments;
    __end2 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::begin(pvVar4);
    elem_segment = (ElemSegment *)
                   std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::end
                             (pvVar4);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wabt::ElemSegment_*const_*,_std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>_>
                                       *)&elem_segment), bVar2) {
      ppEVar9 = __gnu_cxx::
                __normal_iterator<wabt::ElemSegment_*const_*,_std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>_>
                ::operator*(&__end2);
      local_40 = *ppEVar9;
      bVar2 = std::
              vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
              ::empty(&local_40->elem_exprs);
      if (!bVar2) {
        local_48 = local_40->elem_type;
        bVar2 = AreInitializersAlwaysNull(local_48);
        if (!bVar2) {
          local_58 = InternalSymbolScope(this);
          GlobalName::GlobalName(&local_68,ElemSegment,&local_40->name);
          (anonymous_namespace)::CWriter::
          Write<wabt::(anonymous_namespace)::Newline,char_const*,char_const(&)[51],wabt::(anonymous_namespace)::GlobalName,char_const(&)[6],wabt::(anonymous_namespace)::OpenBrace>
                    ((CWriter *)this,&local_49,&local_58,(char (*) [51])0x238b34,&local_68,
                     (char (*) [6])"[] = ",(OpenBrace *)((long)&__range3 + 7));
          this_00 = &local_40->elem_exprs;
          __end3 = std::
                   vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                   ::begin(this_00);
          elem_expr = (ExprList *)
                      std::
                      vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                      ::end(this_00);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<const_wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
                                             *)&elem_expr), bVar2) {
            expr = (Expr *)__gnu_cxx::
                           __normal_iterator<const_wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
                           ::operator*(&__end3);
            sVar7 = intrusive_list<wabt::Expr>::size((intrusive_list<wabt::Expr> *)expr);
            if (sVar7 != 1) {
              __assert_fail("elem_expr.size() == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                            ,0x964,
                            "void wabt::(anonymous namespace)::CWriter::WriteElemInitializers()");
            }
            func = (Func *)intrusive_list<wabt::Expr>::front((intrusive_list<wabt::Expr> *)expr);
            EVar3 = Expr::type((Expr *)func);
            if (EVar3 == GlobalGet) {
              pMVar1 = this->module_;
              pVVar6 = cast<wabt::VarExpr<(wabt::ExprType)20>,wabt::Expr>((Expr *)func);
              local_140 = Module::GetGlobal(pMVar1,&pVVar6->var);
              bVar2 = IsImport(this,&local_140->name);
              if (!bVar2) {
                __assert_fail("IsImport(global->name)",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                              ,0x984,
                              "void wabt::(anonymous namespace)::CWriter::WriteElemInitializers()");
              }
              (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                        (&local_160,(CWriter *)this);
              GlobalName::GlobalName(&local_170,Global,&local_140->name);
              (anonymous_namespace)::CWriter::
              Write<char_const(&)[42],std::__cxx11::string,char_const(&)[3],wabt::(anonymous_namespace)::GlobalName,char_const(&)[4],wabt::(anonymous_namespace)::Newline>
                        ((CWriter *)this,(char (*) [42])"{GlobalGet, NULL, NULL, {NULL}, offsetof(",
                         &local_160,(char (*) [3])0x23cd10,&local_170,(char (*) [4])")},",&local_171
                        );
              std::__cxx11::string::~string((string *)&local_160);
            }
            else if (EVar3 == RefFunc) {
              pMVar1 = this->module_;
              pVVar5 = cast<wabt::VarExpr<(wabt::ExprType)36>,wabt::Expr>((Expr *)func);
              func_type = (FuncType *)Module::GetFunc(pMVar1,&pVVar5->var);
              local_a8 = Module::GetFuncType(this->module_,&(((Func *)func_type)->decl).type_var);
              FuncTypeExpr::FuncTypeExpr(&local_b0,local_a8);
              WrapperRef::WrapperRef(&local_c0,(string *)func_type);
              (anonymous_namespace)::CWriter::
              Write<char_const(&)[11],wabt::(anonymous_namespace)::FuncTypeExpr,char_const(&)[27],wabt::(anonymous_namespace)::WrapperRef,char_const(&)[4]>
                        ((CWriter *)this,(char (*) [11])"{RefFunc, ",&local_b0,
                         (char (*) [27])", (wasm_rt_function_ptr_t)",&local_c0,(char (*) [4])", {");
              bVar2 = Features::tail_call_enabled(&this->options_->features);
              if ((bVar2) &&
                 ((bVar2 = IsImport(this,(string *)func_type), bVar2 ||
                  ((func_type[2].super_TypeEntry.loc.field_1.field2[0] & 1) != 0)))) {
                TailCallRef::TailCallRef(&local_d0,(string *)func_type);
                Write(this,&local_d0);
              }
              else {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_e0,"NULL");
                Write(this,local_e0);
              }
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_f0,"}, ");
              Write(this,local_f0);
              bVar2 = IsImport(this,(string *)func_type);
              if (bVar2) {
                (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                          (&local_110,(CWriter *)this);
                name = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](&this->import_module_sym_map_,(key_type *)func_type);
                GlobalName::GlobalName(&local_120,Import,name);
                (anonymous_namespace)::CWriter::
                Write<char_const(&)[10],std::__cxx11::string,char_const(&)[3],wabt::(anonymous_namespace)::GlobalName,char_const(&)[2]>
                          ((CWriter *)this,(char (*) [10])0x2394f4,&local_110,(char (*) [3])0x23cd10
                           ,&local_120,(char (*) [2])0x238c91);
                std::__cxx11::string::~string((string *)&local_110);
              }
              else {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_130,"0");
                Write(this,local_130);
              }
              (anonymous_namespace)::CWriter::
              Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                        ((CWriter *)this,(char (*) [3])0x2394ff,(Newline *)((long)&global + 7));
            }
            else {
              if (EVar3 != RefNull) {
                abort();
              }
              (anonymous_namespace)::CWriter::
              Write<char_const(&)[34],wabt::(anonymous_namespace)::Newline>
                        ((CWriter *)this,(char (*) [34])"{RefNull, NULL, NULL, {NULL}, 0},",
                         (Newline *)((long)&global + 6));
            }
            __gnu_cxx::
            __normal_iterator<const_wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
            ::operator++(&__end3);
          }
          (anonymous_namespace)::CWriter::
          Write<wabt::(anonymous_namespace)::CloseBrace,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,&local_172,(char (*) [2])0x238bef,&local_173);
        }
      }
      __gnu_cxx::
      __normal_iterator<wabt::ElemSegment_*const_*,_std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>_>
      ::operator++(&__end2);
    }
    (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
              ((string *)&table_idx,(CWriter *)this);
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::Newline,char_const(&)[25],std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,&local_174,(char (*) [25])"static void init_tables(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&table_idx,
               (char (*) [13])"* instance) ",(OpenBrace *)((long)&i + 3));
    std::__cxx11::string::~string((string *)&table_idx);
    sVar7 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::size(&this->module_->tables)
    ;
    if (this->module_->num_table_imports < sVar7) {
      table._4_4_ = this->module_->num_table_imports;
      local_1a0 = table._4_4_;
      for (; uVar10 = (ulong)table._4_4_,
          sVar7 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::size
                            (&this->module_->tables), uVar10 < sVar7; table._4_4_ = table._4_4_ + 1)
      {
        ppTVar8 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::operator[]
                            (&this->module_->tables,(ulong)table._4_4_);
        pTStack_1b0 = *ppTVar8;
        if (((pTStack_1b0->elem_limits).has_max & 1U) == 0) {
          local_298 = 0xffffffff;
        }
        else {
          local_298 = (uint)(pTStack_1b0->elem_limits).max;
        }
        local_1b4 = local_298;
        local_1c0 = GetReferenceTypeName(&pTStack_1b0->elem_type);
        ExternalInstancePtr::GlobalName(&local_1d0,Table,&pTStack_1b0->name);
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[18],char_const*,char_const(&)[8],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[3],unsigned_long_const&,char_const(&)[3],unsigned_int&,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [18])"wasm_rt_allocate_",&local_1c0,
                   (char (*) [8])"_table(",&local_1d0,(char (*) [3])0x23cd10,
                   &(pTStack_1b0->elem_limits).initial,(char (*) [3])0x23cd10,&local_1b4,
                   (char (*) [3])0x239d95,(Newline *)((long)&__range2_1 + 7));
      }
    }
    pvVar4 = &this->module_->elem_segments;
    __end2_1 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::begin(pvVar4)
    ;
    elem_segment_1 =
         (ElemSegment *)
         std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::end(pvVar4);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<wabt::ElemSegment_*const_*,_std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>_>
                               *)&elem_segment_1), bVar2) {
      ppEVar9 = __gnu_cxx::
                __normal_iterator<wabt::ElemSegment_*const_*,_std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>_>
                ::operator*(&__end2_1);
      table_1 = (Table *)*ppEVar9;
      if (((ElemSegment *)table_1)->kind == Active) {
        local_200 = Module::GetTable(this->module_,&((ElemSegment *)table_1)->table_var);
        WriteElemTableInit(this,true,(ElemSegment *)table_1,local_200);
      }
      __gnu_cxx::
      __normal_iterator<wabt::ElemSegment_*const_*,_std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>_>
      ::operator++(&__end2_1);
    }
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,&local_201,&local_202);
    bVar2 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::empty
                      (&this->module_->elem_segments);
    if (!bVar2) {
      (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_(&local_228,(CWriter *)this);
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::Newline,char_const(&)[33],std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
                ((CWriter *)this,&local_203,(char (*) [33])"static void init_elem_instances(",
                 &local_228,(char (*) [13])" *instance) ",(OpenBrace *)((long)&__range3_1 + 7));
      std::__cxx11::string::~string((string *)&local_228);
      pvVar4 = &this->module_->elem_segments;
      __end3_1 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::begin
                           (pvVar4);
      elem_segment_2 =
           (ElemSegment *)
           std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::end(pvVar4);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<wabt::ElemSegment_*const_*,_std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>_>
                                 *)&elem_segment_2), bVar2) {
        ppEVar9 = __gnu_cxx::
                  __normal_iterator<wabt::ElemSegment_*const_*,_std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>_>
                  ::operator*(&__end3_1);
        local_250 = *ppEVar9;
        bVar2 = is_droppable(local_250);
        if (bVar2) {
          GlobalName::GlobalName(&local_260,ElemSegment,&local_250->name);
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[32],wabt::(anonymous_namespace)::GlobalName,char_const(&)[10],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [32])0x239650,&local_260,(char (*) [10])" = false;",
                     &local_261);
        }
        __gnu_cxx::
        __normal_iterator<wabt::ElemSegment_*const_*,_std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>_>
        ::operator++(&__end3_1);
      }
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,&local_262,&local_263);
    }
  }
  return;
}

Assistant:

void CWriter::WriteElemInitializers() {
  if (module_->tables.empty()) {
    return;
  }

  for (const ElemSegment* elem_segment : module_->elem_segments) {
    if (elem_segment->elem_exprs.empty()) {
      continue;
    }

    if (AreInitializersAlwaysNull(elem_segment->elem_type)) {
      // no need to store these initializers because only ref.null is possible
      continue;
    }

    Write(Newline(), InternalSymbolScope(),
          "const wasm_elem_segment_expr_t elem_segment_exprs_",
          GlobalName(ModuleFieldType::ElemSegment, elem_segment->name),
          "[] = ", OpenBrace());

    for (const ExprList& elem_expr : elem_segment->elem_exprs) {
      assert(elem_expr.size() == 1);
      const Expr& expr = elem_expr.front();
      switch (expr.type()) {
        case ExprType::RefFunc: {
          const Func* func = module_->GetFunc(cast<RefFuncExpr>(&expr)->var);
          const FuncType* func_type = module_->GetFuncType(func->decl.type_var);
          Write("{RefFunc, ", FuncTypeExpr(func_type),
                ", (wasm_rt_function_ptr_t)", WrapperRef(func->name), ", {");
          if (options_.features.tail_call_enabled() &&
              (IsImport(func->name) || func->features_used.tailcall)) {
            Write(TailCallRef(func->name));
          } else {
            Write("NULL");
          }
          Write("}, ");

          if (IsImport(func->name)) {
            Write("offsetof(", ModuleInstanceTypeName(), ", ",
                  GlobalName(ModuleFieldType::Import,
                             import_module_sym_map_[func->name]),
                  ")");
          } else {
            Write("0");
          }
          Write("},", Newline());
        } break;
        case ExprType::RefNull:
          Write("{RefNull, NULL, NULL, {NULL}, 0},", Newline());
          break;
        case ExprType::GlobalGet: {
          const Global* global =
              module_->GetGlobal(cast<GlobalGetExpr>(&expr)->var);
          assert(IsImport(global->name));
          Write("{GlobalGet, NULL, NULL, {NULL}, offsetof(",
                ModuleInstanceTypeName(), ", ",
                GlobalName(ModuleFieldType::Global, global->name), ")},",
                Newline());
        } break;
        default:
          WABT_UNREACHABLE;
      }
    }
    Write(CloseBrace(), ";", Newline());
  }

  Write(Newline(), "static void init_tables(", ModuleInstanceTypeName(),
        "* instance) ", OpenBrace());

  if (module_->tables.size() > module_->num_table_imports) {
    Index table_idx = module_->num_table_imports;
    for (Index i = table_idx; i < module_->tables.size(); i++) {
      const Table* table = module_->tables[i];
      uint32_t max =
          table->elem_limits.has_max ? table->elem_limits.max : UINT32_MAX;
      Write("wasm_rt_allocate_", GetReferenceTypeName(table->elem_type),
            "_table(", ExternalInstancePtr(ModuleFieldType::Table, table->name),
            ", ", table->elem_limits.initial, ", ", max, ");", Newline());
    }
  }

  for (const ElemSegment* elem_segment : module_->elem_segments) {
    if (elem_segment->kind != SegmentKind::Active) {
      continue;
    }

    const Table* table = module_->GetTable(elem_segment->table_var);

    WriteElemTableInit(true, elem_segment, table);
  }

  Write(CloseBrace(), Newline());

  if (!module_->elem_segments.empty()) {
    Write(Newline(), "static void init_elem_instances(",
          ModuleInstanceTypeName(), " *instance) ", OpenBrace());

    for (const ElemSegment* elem_segment : module_->elem_segments) {
      if (is_droppable(elem_segment)) {
        Write("instance->elem_segment_dropped_",
              GlobalName(ModuleFieldType::ElemSegment, elem_segment->name),
              " = false;", Newline());
      }
    }

    Write(CloseBrace(), Newline());
  }
}